

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

Div_Type_t Bmc_FxDivOr(int LitA,int LitB,int *pLits,int *pPhase)

{
  int iVar1;
  int iVar2;
  int t;
  int *pPhase_local;
  int *pLits_local;
  int local_10;
  int LitB_local;
  int LitA_local;
  
  if (LitA != LitB) {
    iVar1 = Abc_Lit2Var(LitA);
    iVar2 = Abc_Lit2Var(LitB);
    if (iVar1 == iVar2) {
      LitB_local = 0;
    }
    else {
      pLits_local._4_4_ = LitB;
      local_10 = LitA;
      if (LitB < LitA) {
        pLits_local._4_4_ = LitA;
        local_10 = LitB;
      }
      iVar1 = Abc_LitNot(local_10);
      *pLits = iVar1;
      iVar1 = Abc_LitNot(pLits_local._4_4_);
      pLits[1] = iVar1;
      *pPhase = 1;
      LitB_local = 1;
    }
    return LitB_local;
  }
  __assert_fail("LitA != LitB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                ,0xb1,"Div_Type_t Bmc_FxDivOr(int, int, int *, int *)");
}

Assistant:

static inline Div_Type_t Bmc_FxDivOr( int LitA, int LitB, int * pLits, int * pPhase )
{
    assert( LitA != LitB );
    if ( Abc_Lit2Var(LitA) == Abc_Lit2Var(LitB) )
        return DIV_CST;
    if ( LitA > LitB )
        ABC_SWAP( int, LitA, LitB );
    pLits[0] = Abc_LitNot(LitA);
    pLits[1] = Abc_LitNot(LitB);
    *pPhase = 1;
    return DIV_AND;
}